

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O1

void __thiscall KVStore::~KVStore(KVStore *this)

{
  SkipList *this_00;
  undefined1 *puVar1;
  pointer pcVar2;
  uint64_t timeStamp;
  void *pvVar3;
  void *pvVar4;
  uint __val;
  uint uVar5;
  int iVar6;
  unsigned_long uVar7;
  long *plVar8;
  SSTableCache *pSVar9;
  _Rb_tree_node_base *p_Var10;
  uint uVar11;
  __nlink_t *timeStamp_00;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  __mode_t __mode;
  pointer ppVar15;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  pointer *local_160;
  long local_158;
  pointer local_150 [2];
  SSTableCache *local_140;
  long local_138;
  undefined1 local_130 [48];
  pair<unsigned_long,_int> *local_100 [2];
  pair<unsigned_long,_int> local_f0;
  string local_e0;
  undefined1 local_c0 [144];
  
  (this->super_KVStoreAPI)._vptr_KVStoreAPI = (_func_int **)&PTR_put_00113d40;
  this_00 = &this->memTable;
  uVar7 = SkipList::getLength(this_00);
  if (uVar7 == 0) goto LAB_001077bb;
  pcVar2 = (this->storagePath)._M_dataplus._M_p;
  local_100[0] = &local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,pcVar2,pcVar2 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)local_100);
  iVar6 = stat((char *)local_100[0],(stat *)local_c0);
  uVar14 = (uint)local_c0._24_4_ >> 0xe;
  if (local_100[0] != &local_f0) {
    operator_delete(local_100[0],local_f0.first + 1);
  }
  if (((byte)uVar14 & 1 & iVar6 == 0) == 0) {
    pcVar2 = (this->storagePath)._M_dataplus._M_p;
    local_c0._0_8_ = local_c0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,pcVar2,pcVar2 + (this->storagePath)._M_string_length);
    __mode = 0x10f020;
    std::__cxx11::string::append(local_c0);
    utils::mkdir((char *)local_c0._0_8_,__mode);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
  }
  local_160 = local_150;
  pcVar2 = (this->storagePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar2,pcVar2 + (this->storagePath)._M_string_length);
  std::__cxx11::string::append((char *)&local_160);
  uVar14 = this->fileNums;
  this->fileNums = uVar14 + 1;
  __val = -uVar14;
  if (0 < (int)uVar14) {
    __val = uVar14;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar11 = (uint)uVar12;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00107569;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00107569;
      }
      if (uVar11 < 10000) goto LAB_00107569;
      uVar12 = uVar12 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_00107569:
  puVar1 = local_130 + 0x20;
  local_130._16_8_ = puVar1;
  std::__cxx11::string::_M_construct
            ((ulong)(local_130 + 0x10),(char)__len - (char)((int)uVar14 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_130._16_8_ + (ulong)(uVar14 >> 0x1f)),__len,__val);
  ppVar15 = (pointer)0xf;
  if (local_160 != local_150) {
    ppVar15 = local_150[0];
  }
  if (ppVar15 < (pointer)(local_130._24_8_ + local_158)) {
    ppVar15 = (pointer)0xf;
    if ((undefined1 *)local_130._16_8_ != puVar1) {
      ppVar15 = (pointer)local_130._32_8_;
    }
    if (ppVar15 < (pointer)(local_130._24_8_ + local_158)) goto LAB_001075dd;
    plVar8 = (long *)std::__cxx11::string::replace
                               ((ulong)(local_130 + 0x10),0,(char *)0x0,(ulong)local_160);
  }
  else {
LAB_001075dd:
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_160,local_130._16_8_);
  }
  local_140 = (SSTableCache *)local_130;
  pSVar9 = (SSTableCache *)(plVar8 + 2);
  if ((SSTableCache *)*plVar8 == pSVar9) {
    local_130._0_8_ = (pSVar9->header).timeStamp;
    local_130._8_8_ = plVar8[3];
  }
  else {
    local_130._0_8_ = (pSVar9->header).timeStamp;
    local_140 = (SSTableCache *)*plVar8;
  }
  local_138 = plVar8[1];
  *plVar8 = (long)pSVar9;
  plVar8[1] = 0;
  *(undefined1 *)&(pSVar9->header).timeStamp = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  timeStamp_00 = (__nlink_t *)(plVar8 + 2);
  if ((__nlink_t *)*plVar8 == timeStamp_00) {
    local_c0._16_8_ = *timeStamp_00;
    local_c0._24_8_ = plVar8[3];
    local_c0._0_8_ = local_c0 + 0x10;
  }
  else {
    local_c0._16_8_ = *timeStamp_00;
    local_c0._0_8_ = (__nlink_t *)*plVar8;
  }
  local_c0._8_8_ = plVar8[1];
  *plVar8 = (long)timeStamp_00;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_140 != (SSTableCache *)local_130) {
    operator_delete(local_140,local_130._0_8_ + 1);
  }
  if ((undefined1 *)local_130._16_8_ != puVar1) {
    operator_delete((void *)local_130._16_8_,(ulong)((long)(unsigned_long *)local_130._32_8_ + 1));
  }
  if (local_160 != local_150) {
    operator_delete(local_160,(ulong)((long)&local_150[0]->first + 1));
  }
  SSTable::toSSTable((SSTable *)this_00,(SkipList *)local_c0,(string *)this->timeStamp,
                     (uint64_t)timeStamp_00);
  pSVar9 = (SSTableCache *)operator_new(0x2858);
  timeStamp = this->timeStamp;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_c0._0_8_,
             (_func_result_type_void_ptr *)(local_c0._8_8_ + local_c0._0_8_));
  SSTableCache::SSTableCache(pSVar9,this_00,timeStamp,&local_e0);
  local_140 = pSVar9;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
  ::_M_emplace_unique<std::__cxx11::string&,SSTableCache*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,SSTableCache*>,std::_Select1st<std::pair<std::__cxx11::string_const,SSTableCache*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
              *)&this->cache,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             &local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  compaction(this,0);
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
LAB_001077bb:
  for (p_Var10 = (this->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &(this->cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    pvVar3 = *(void **)(p_Var10 + 2);
    if (pvVar3 != (void *)0x0) {
      if (*(long **)((long)pvVar3 + 0x2838) != (long *)((long)pvVar3 + 0x2848)) {
        operator_delete(*(long **)((long)pvVar3 + 0x2838),*(long *)((long)pvVar3 + 0x2848) + 1);
      }
      pvVar4 = *(void **)((long)pvVar3 + 0x20);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,*(long *)((long)pvVar3 + 0x30) - (long)pvVar4);
      }
      operator_delete(pvVar3,0x2858);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  ::~_Rb_tree(&(this->cache)._M_t);
  SkipList::~SkipList(this_00);
  pcVar2 = (this->storagePath)._M_dataplus._M_p;
  paVar13 = &(this->storagePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar13) {
    operator_delete(pcVar2,paVar13->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

KVStore::~KVStore() {
  if (memTable.getLength() > 0) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());
    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    compaction(0);
  }

  for (auto &c : cache) delete c.second;
}